

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O2

void __thiscall CBanEntry::CBanEntry(CBanEntry *this,UniValue *json)

{
  int iVar1;
  UniValue *pUVar2;
  long lVar3;
  long in_FS_OFFSET;
  allocator<char> local_49;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"version",&local_49);
  pUVar2 = UniValue::operator[](json,&local_48);
  iVar1 = UniValue::getInt<int>(pUVar2);
  std::__cxx11::string::~string((string *)&local_48);
  this->nVersion = iVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ban_created",&local_49);
  pUVar2 = UniValue::operator[](json,&local_48);
  lVar3 = UniValue::getInt<long>(pUVar2);
  std::__cxx11::string::~string((string *)&local_48);
  this->nCreateTime = lVar3;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"banned_until",&local_49);
  pUVar2 = UniValue::operator[](json,&local_48);
  lVar3 = UniValue::getInt<long>(pUVar2);
  std::__cxx11::string::~string((string *)&local_48);
  this->nBanUntil = lVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CBanEntry::CBanEntry(const UniValue& json)
    : nVersion(json[BANMAN_JSON_VERSION_KEY].getInt<int>()),
      nCreateTime(json["ban_created"].getInt<int64_t>()),
      nBanUntil(json["banned_until"].getInt<int64_t>())
{
}